

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

int luaD_reallocstack(lua_State *L,int newsize,int raiseerror)

{
  lu_byte lVar1;
  int iVar2;
  UpVal *pUVar3;
  CallInfo *pCVar4;
  StkId pSVar5;
  long lVar6;
  lu_byte *plVar7;
  int iVar8;
  
  pSVar5 = (L->stack_last).p;
  lVar6 = (L->stack).offset;
  lVar1 = L->l_G->gcstopem;
  (L->top).p = (StkId)((long)(L->top).p - lVar6);
  (L->tbclist).p = (StkId)((long)(L->tbclist).p - lVar6);
  for (pUVar3 = L->openupval; pUVar3 != (UpVal *)0x0; pUVar3 = (pUVar3->u).open.next) {
    (pUVar3->v).p = (TValue *)((long)(pUVar3->v).p - (L->stack).offset);
  }
  for (pCVar4 = L->ci; pCVar4 != (CallInfo *)0x0; pCVar4 = pCVar4->previous) {
    (pCVar4->top).p = (StkId)((long)(pCVar4->top).p - (L->stack).offset);
    (pCVar4->func).p = (StkId)((long)(pCVar4->func).p - (L->stack).offset);
  }
  L->l_G->gcstopem = '\x01';
  iVar8 = (int)((ulong)((long)pSVar5 - lVar6) >> 4);
  pSVar5 = (StkId)luaM_realloc_(L,(L->stack).p,(long)iVar8 * 0x10 + 0x50,(long)newsize * 0x10 + 0x50
                               );
  L->l_G->gcstopem = lVar1;
  if (pSVar5 == (StkId)0x0) {
    correctstack(L);
    iVar2 = 0;
    if (raiseerror != 0) {
      luaD_throw(L,4);
    }
  }
  else {
    (L->stack).p = pSVar5;
    correctstack(L);
    (L->stack_last).p = (L->stack).p + newsize;
    iVar2 = 1;
    if (iVar8 < newsize) {
      lVar6 = (long)(iVar8 + 5);
      plVar7 = &(&pSVar5->val)[lVar6].tt_;
      do {
        *plVar7 = '\0';
        lVar6 = lVar6 + 1;
        plVar7 = plVar7 + 0x10;
      } while (lVar6 < newsize + 5);
    }
  }
  return iVar2;
}

Assistant:

int luaD_reallocstack (lua_State *L, int newsize, int raiseerror) {
  int oldsize = stacksize(L);
  int i;
  StkId newstack;
  int oldgcstop = G(L)->gcstopem;
  lua_assert(newsize <= LUAI_MAXSTACK || newsize == ERRORSTACKSIZE);
  relstack(L);  /* change pointers to offsets */
  G(L)->gcstopem = 1;  /* stop emergency collection */
  newstack = luaM_reallocvector(L, L->stack.p, oldsize + EXTRA_STACK,
                                   newsize + EXTRA_STACK, StackValue);
  G(L)->gcstopem = oldgcstop;  /* restore emergency collection */
  if (l_unlikely(newstack == NULL)) {  /* reallocation failed? */
    correctstack(L);  /* change offsets back to pointers */
    if (raiseerror)
      luaM_error(L);
    else return 0;  /* do not raise an error */
  }
  L->stack.p = newstack;
  correctstack(L);  /* change offsets back to pointers */
  L->stack_last.p = L->stack.p + newsize;
  for (i = oldsize + EXTRA_STACK; i < newsize + EXTRA_STACK; i++)
    setnilvalue(s2v(newstack + i)); /* erase new segment */
  return 1;
}